

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall DROPlayer::SetDeviceOptions(DROPlayer *this,UINT32 id,PLR_DEV_OPTS *devOpts)

{
  ulong __n;
  size_t sVar1;
  size_type sVar2;
  reference chipDev;
  size_t devID;
  size_t optID;
  PLR_DEV_OPTS *devOpts_local;
  UINT32 id_local;
  DROPlayer *this_local;
  
  sVar1 = DeviceID2OptionID(this,id);
  if (sVar1 == 0xffffffffffffffff) {
    this_local._7_1_ = 0x80;
  }
  else {
    memcpy(this->_devOpts + sVar1,devOpts,0xa0);
    __n = this->_optDevMap[sVar1];
    sVar2 = std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::size
                      (&this->_devices);
    if (__n < sVar2) {
      chipDev = std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::
                operator[](&this->_devices,__n);
      RefreshMuting(this,chipDev,&this->_devOpts[sVar1].muteOpts);
    }
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UINT8 DROPlayer::SetDeviceOptions(UINT32 id, const PLR_DEV_OPTS& devOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID] = devOpts;
	// no immediate changes necessary for OPL2/OPL3
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
	return 0x00;
}